

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.h
# Opt level: O0

Image * __thiscall pbrt::Image::operator=(Image *this,Image *param_2)

{
  uintptr_t uVar1;
  ColorEncodingHandle *in_RSI;
  Image *in_RDI;
  vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_> *unaff_retaddr;
  InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_00000018;
  
  uVar1 = (in_RSI->
          super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
          ).bits;
  in_RDI->format = (int)uVar1;
  (in_RDI->resolution).super_Tuple2<pbrt::Point2,_int>.x = (int)(uVar1 >> 0x20);
  (in_RDI->resolution).super_Tuple2<pbrt::Point2,_int>.y =
       (int)in_RSI[1].
            super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
            .bits;
  InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(in_stack_00000018,
              (InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)this);
  ColorEncodingHandle::operator=(in_RSI,(ColorEncodingHandle *)in_RDI);
  pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::operator=
            ((vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> *)param_2,
             (vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> *)
             unaff_retaddr);
  pstd::vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_>::operator=
            ((vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_> *)param_2,
             unaff_retaddr);
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator=
            ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)param_2,
             (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)unaff_retaddr);
  return in_RDI;
}

Assistant:

Image(Allocator alloc = {})
        : p8(alloc),
          p16(alloc),
          p32(alloc),
          format(PixelFormat::U256),
          resolution(0, 0) {}